

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void lj_record_tailcall(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  ulong uVar1;
  int iVar2;
  
  rec_call_setup(J,func,nargs);
  uVar1 = J->L->base[-1].u64;
  if (((uint)uVar1 & 7) == 3) {
    iVar2 = J->framedepth;
    J->framedepth = iVar2 + -1;
    if (iVar2 < 1) {
      lj_trace_err(J,LJ_TRERR_NYIRETL);
    }
    iVar2 = (int)(uVar1 >> 3);
    J->baseslot = J->baseslot - iVar2;
    J->base = (TRef *)((long)J->base - (uVar1 >> 1 & 0x3fffffffc));
    func = func + iVar2;
  }
  if (J->baseslot == 2) {
    J->base[func + 1] = 0x10000;
  }
  memmove(J->base + -2,J->base + func,(ulong)(J->maxslot + 2) << 2);
  iVar2 = J->tailcalled;
  J->tailcalled = iVar2 + 1;
  if (iVar2 < J->loopunroll) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_LUNROLL);
}

Assistant:

void lj_record_tailcall(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  rec_call_setup(J, func, nargs);
  if (frame_isvarg(J->L->base - 1)) {
    BCReg cbase = (BCReg)frame_delta(J->L->base - 1);
    if (--J->framedepth < 0)
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    func += cbase;
  }
  /* Move func + args down. */
  if (LJ_FR2 && J->baseslot == 2)
    J->base[func+1] = TREF_FRAME;
  memmove(&J->base[-1-LJ_FR2], &J->base[func], sizeof(TRef)*(J->maxslot+1+LJ_FR2));
  /* Note: the new TREF_FRAME is now at J->base[-1] (even for slot #0). */
  /* Tailcalls can form a loop, so count towards the loop unroll limit. */
  if (++J->tailcalled > J->loopunroll)
    lj_trace_err(J, LJ_TRERR_LUNROLL);
}